

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

bool __thiscall
cmELFInternalImpl<cmELFTypes64>::LoadSectionHeader(cmELFInternalImpl<cmELFTypes64> *this,uint i)

{
  bool bVar1;
  pointer pbVar2;
  reference pvVar3;
  fpos<__mbstate_t> local_30;
  uint local_1c;
  cmELFInternalImpl<cmELFTypes64> *pcStack_18;
  uint i_local;
  cmELFInternalImpl<cmELFTypes64> *this_local;
  
  local_1c = i;
  pcStack_18 = this;
  pbVar2 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator->(&(this->super_cmELFInternal).Stream);
  std::fpos<__mbstate_t>::fpos
            (&local_30,(this->ELFHeader).e_shoff + (ulong)((this->ELFHeader).e_shentsize * local_1c)
            );
  std::istream::seekg(pbVar2,local_30._M_off,local_30._M_state);
  pvVar3 = std::vector<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>::operator[]
                     (&this->SectionHeaders,(ulong)local_1c);
  bVar1 = Read(this,pvVar3);
  if (bVar1) {
    pvVar3 = std::vector<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>::operator[]
                       (&this->SectionHeaders,(ulong)local_1c);
    if (pvVar3->sh_type == 6) {
      (this->super_cmELFInternal).DynamicSectionIndex = local_1c;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool LoadSectionHeader(unsigned int i)
  {
    // Read the section header from the file.
    this->Stream->seekg(this->ELFHeader.e_shoff +
                        this->ELFHeader.e_shentsize * i);
    if (!this->Read(this->SectionHeaders[i])) {
      return false;
    }

    // Identify some important sections.
    if (this->SectionHeaders[i].sh_type == SHT_DYNAMIC) {
      this->DynamicSectionIndex = static_cast<int>(i);
    }
    return true;
  }